

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm2js.h
# Opt level: O3

void __thiscall wasm::Wasm2JSGlue::emitPreES6(Wasm2JSGlue *this)

{
  pointer puVar1;
  _Head_base<0UL,_wasm::Global_*,_false> _Var2;
  char *pcVar3;
  pointer puVar4;
  _Head_base<0UL,_wasm::Table_*,_false> _Var5;
  pointer puVar6;
  _Head_base<0UL,_wasm::Function_*,_false> _Var7;
  char *pcVar8;
  Module *pMVar9;
  iterator __begin2;
  pointer puVar10;
  pointer puVar11;
  iterator __end2_2;
  iterator __end2;
  pointer puVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  Name module;
  Name module_00;
  Name module_01;
  Name base;
  undefined1 local_148 [8];
  unordered_map<wasm::Name,_wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>_>
  baseModuleMap;
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  seenModules;
  ImportInfo imports;
  anon_class_24_3_09f8b868 noteImport;
  char local_31;
  
  local_148 = (undefined1  [8])&baseModuleMap._M_h._M_rehash_policy._M_next_resize;
  baseModuleMap._M_h._M_buckets = (__buckets_ptr)0x1;
  baseModuleMap._M_h._M_bucket_count = 0;
  baseModuleMap._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  baseModuleMap._M_h._M_element_count._0_4_ = 0x3f800000;
  baseModuleMap._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  baseModuleMap._M_h._M_rehash_policy._4_4_ = 0;
  baseModuleMap._M_h._M_rehash_policy._M_next_resize = 0;
  baseModuleMap._M_h._M_single_bucket =
       (__node_base_ptr)&seenModules._M_h._M_rehash_policy._M_next_resize;
  seenModules._M_h._M_buckets = (__buckets_ptr)0x1;
  seenModules._M_h._M_bucket_count = 0;
  seenModules._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  seenModules._M_h._M_element_count._0_4_ = 0x3f800000;
  seenModules._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  seenModules._M_h._M_rehash_policy._4_4_ = 0;
  seenModules._M_h._M_rehash_policy._M_next_resize = 0;
  imports.importedTags.super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)local_148;
  ImportInfo::ImportInfo((ImportInfo *)&seenModules._M_h._M_single_bucket,this->wasm);
  pMVar9 = this->wasm;
  puVar10 = (pMVar9->globals).
            super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pMVar9->globals).
           super__Vector_base<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>,_std::allocator<std::unique_ptr<wasm::Global,_std::default_delete<wasm::Global>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar10 != puVar1) {
    do {
      _Var2._M_head_impl =
           (puVar10->_M_t).super___uniq_ptr_impl<wasm::Global,_std::default_delete<wasm::Global>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Global_*,_std::default_delete<wasm::Global>_>.
           super__Head_base<0UL,_wasm::Global_*,_false>._M_head_impl;
      pcVar3 = *(char **)((long)&(_Var2._M_head_impl)->super_Importable + 0x20);
      if (pcVar3 != (char *)0x0) {
        module.super_IString.str._M_str = pcVar3;
        module.super_IString.str._M_len =
             *(size_t *)
              &((Name *)((long)&(_Var2._M_head_impl)->super_Importable + 0x18))->super_IString;
        emitPreES6::anon_class_24_3_09f8b868::operator()
                  ((anon_class_24_3_09f8b868 *)
                   &imports.importedTags.
                    super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,module,
                   (Name)(((Name *)((long)&(_Var2._M_head_impl)->super_Importable + 0x28))->
                         super_IString).str);
      }
      puVar10 = puVar10 + 1;
    } while (puVar10 != puVar1);
    pMVar9 = this->wasm;
  }
  puVar11 = (pMVar9->tables).
            super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar4 = (pMVar9->tables).
           super__Vector_base<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>,_std::allocator<std::unique_ptr<wasm::Table,_std::default_delete<wasm::Table>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar11 != puVar4) {
    do {
      _Var5._M_head_impl =
           (puVar11->_M_t).super___uniq_ptr_impl<wasm::Table,_std::default_delete<wasm::Table>_>.
           _M_t.super__Tuple_impl<0UL,_wasm::Table_*,_std::default_delete<wasm::Table>_>.
           super__Head_base<0UL,_wasm::Table_*,_false>._M_head_impl;
      pcVar3 = *(char **)((long)&(_Var5._M_head_impl)->super_Importable + 0x20);
      if (pcVar3 != (char *)0x0) {
        module_00.super_IString.str._M_str = pcVar3;
        module_00.super_IString.str._M_len =
             *(size_t *)
              &((Name *)((long)&(_Var5._M_head_impl)->super_Importable + 0x18))->super_IString;
        emitPreES6::anon_class_24_3_09f8b868::operator()
                  ((anon_class_24_3_09f8b868 *)
                   &imports.importedTags.
                    super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,module_00,
                   (Name)(((Name *)((long)&(_Var5._M_head_impl)->super_Importable + 0x28))->
                         super_IString).str);
      }
      puVar11 = puVar11 + 1;
    } while (puVar11 != puVar4);
    pMVar9 = this->wasm;
  }
  puVar6 = (pMVar9->functions).
           super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar12 = (pMVar9->functions).
                 super__Vector_base<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>,_std::allocator<std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; puVar12 != puVar6; puVar12 = puVar12 + 1
      ) {
    _Var7._M_head_impl =
         (puVar12->_M_t).super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
         ._M_t.super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    pcVar3 = *(char **)((long)&(_Var7._M_head_impl)->super_Importable + 0x20);
    if (pcVar3 != (char *)0x0) {
      pcVar8 = *(char **)((long)&(_Var7._M_head_impl)->super_Importable + 0x30);
      iVar16 = (int)pcVar8;
      iVar17 = (int)((ulong)pcVar8 >> 0x20);
      auVar19._0_4_ = -(uint)((int)_visitCall == iVar16);
      auVar19._4_4_ = -(uint)((int)((ulong)_visitCall >> 0x20) == iVar17);
      auVar19._8_4_ = -(uint)((int)_finalize == iVar16);
      auVar19._12_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar17);
      auVar22._4_4_ = auVar19._0_4_;
      auVar22._0_4_ = auVar19._4_4_;
      auVar22._8_4_ = auVar19._12_4_;
      auVar22._12_4_ = auVar19._8_4_;
      auVar21._0_4_ = -(uint)((int)_finalize == iVar16);
      auVar21._4_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar17);
      auVar21._8_4_ = -(uint)((int)UINT16ARRAY == iVar16);
      auVar21._12_4_ = -(uint)((int)((ulong)UINT16ARRAY >> 0x20) == iVar17);
      auVar20._4_4_ = auVar21._0_4_;
      auVar20._0_4_ = auVar21._4_4_;
      auVar20._8_4_ = auVar21._12_4_;
      auVar20._12_4_ = auVar21._8_4_;
      auVar21 = packssdw(auVar20 & auVar21,auVar22 & auVar19);
      auVar13._0_4_ = -(uint)((int)_parseExpression == iVar16);
      auVar13._4_4_ = -(uint)((int)((ulong)_parseExpression >> 0x20) == iVar17);
      auVar13._8_4_ = -(uint)((int)_visitSIMDShift == iVar16);
      auVar13._12_4_ = -(uint)((int)((ulong)_visitSIMDShift >> 0x20) == iVar17);
      auVar18._4_4_ = auVar13._0_4_;
      auVar18._0_4_ = auVar13._4_4_;
      auVar18._8_4_ = auVar13._12_4_;
      auVar18._12_4_ = auVar13._8_4_;
      auVar15._0_4_ = -(uint)((int)_finalize == iVar16);
      auVar15._4_4_ = -(uint)((int)((ulong)_finalize >> 0x20) == iVar17);
      auVar15._8_4_ = -(uint)((int)ABI::wasm2js::SCRATCH_LOAD_F64 == iVar16);
      auVar15._12_4_ = -(uint)((int)((ulong)ABI::wasm2js::SCRATCH_LOAD_F64 >> 0x20) == iVar17);
      auVar14._4_4_ = auVar15._0_4_;
      auVar14._0_4_ = auVar15._4_4_;
      auVar14._8_4_ = auVar15._12_4_;
      auVar14._12_4_ = auVar15._8_4_;
      auVar15 = packssdw(auVar14 & auVar15,auVar18 & auVar13);
      auVar15 = packssdw(auVar15,auVar21);
      if (((((((((((auVar15 >> 0xf & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                  (auVar15 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                 (auVar15 >> 0x2f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                (auVar15 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
               (auVar15 >> 0x4f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
              (auVar15 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             (auVar15 >> 0x6f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
             -1 < auVar15[0xf]) && (cashew::TRSHIFT != pcVar8)) && (cashew::SET != pcVar8)) &&
         (((_visitRefTest != pcVar8 && (_Init != pcVar8)) &&
          ((_finalize != pcVar8 && (__M_create != pcVar8)))))) {
        module_01.super_IString.str._M_str = pcVar3;
        module_01.super_IString.str._M_len =
             *(size_t *)
              &((Name *)((long)&(_Var7._M_head_impl)->super_Importable + 0x18))->super_IString;
        base.super_IString.str._M_str = pcVar8;
        base.super_IString.str._M_len =
             *(size_t *)
              &((Name *)((long)&(_Var7._M_head_impl)->super_Importable + 0x28))->super_IString;
        emitPreES6::anon_class_24_3_09f8b868::operator()
                  ((anon_class_24_3_09f8b868 *)
                   &imports.importedTags.
                    super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,module_01,base);
      }
    }
  }
  local_31 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(this->out + 0x200),&local_31,1);
  if (imports.importedMemories.super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(imports.importedMemories.
                    super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)imports.importedTags.
                          super__Vector_base<wasm::Tag_*,_std::allocator<wasm::Tag_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)imports.importedMemories.
                          super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (imports.importedTables.super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(imports.importedTables.
                    super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)imports.importedMemories.
                          super__Vector_base<wasm::Memory_*,_std::allocator<wasm::Memory_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)imports.importedTables.
                          super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  }
  if (imports.importedFunctions.
      super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(imports.importedFunctions.
                    super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)imports.importedTables.
                          super__Vector_base<wasm::Table_*,_std::allocator<wasm::Table_*>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)imports.importedFunctions.
                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (imports.importedGlobals.super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) {
    operator_delete(imports.importedGlobals.
                    super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                    (long)imports.importedFunctions.
                          super__Vector_base<wasm::Function_*,_std::allocator<wasm::Function_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)imports.importedGlobals.
                          super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  if (imports.wasm != (Module *)0x0) {
    operator_delete(imports.wasm,
                    (long)imports.importedGlobals.
                          super__Vector_base<wasm::Global_*,_std::allocator<wasm::Global_*>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)imports.wasm);
  }
  std::
  _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                 *)&baseModuleMap._M_h._M_single_bucket);
  std::
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable((_Hashtable<wasm::Name,_std::pair<const_wasm::Name,_wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                 *)local_148);
  return;
}

Assistant:

void Wasm2JSGlue::emitPreES6() {
  std::unordered_map<Name, Name> baseModuleMap;
  std::unordered_set<Name> seenModules;

  auto noteImport = [&](Name module, Name base) {
    // Right now codegen requires a flat namespace going into the module,
    // meaning we don't support importing the same name from multiple namespaces
    // yet.
    if (baseModuleMap.count(base) && baseModuleMap[base] != module) {
      Fatal() << "the name " << base << " cannot be imported from "
              << "two different modules yet";
    }
    baseModuleMap[base] = module;
    if (seenModules.count(module) == 0) {
      out << "import * as " << asmangle(module.toString()) << " from '"
          << module << "';\n";
      seenModules.insert(module);
    }
  };

  ImportInfo imports(wasm);

  ModuleUtils::iterImportedGlobals(
    wasm, [&](Global* import) { noteImport(import->module, import->base); });
  ModuleUtils::iterImportedTables(
    wasm, [&](Table* import) { noteImport(import->module, import->base); });
  ModuleUtils::iterImportedFunctions(wasm, [&](Function* import) {
    // The special helpers are emitted in the glue, see code and comments
    // below.
    if (ABI::wasm2js::isHelper(import->base)) {
      return;
    }
    noteImport(import->module, import->base);
  });

  out << '\n';
}